

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O1

int kex_method_ecdh_key_exchange(LIBSSH2_SESSION *session,key_exchange_state_low_t *key_state)

{
  int iVar1;
  char *errmsg;
  libssh2_curve_type type;
  uchar *s;
  
  if (key_state->state == libssh2_NB_state_idle) {
    key_state->public_key_oct = (uchar *)0x0;
    key_state->state = libssh2_NB_state_created;
  }
  if (key_state->state == libssh2_NB_state_created) {
    iVar1 = kex_session_ecdh_curve_type(session->kex->name,&type);
    if (iVar1 != 0) goto LAB_0011011b;
    iVar1 = _libssh2_ecdsa_create_key
                      (session,&key_state->private_key,&key_state->public_key_oct,
                       &key_state->public_key_oct_len,type);
    if (iVar1 == 0) {
      key_state->request[0] = '\x1e';
      s = key_state->request + 1;
      _libssh2_store_str(&s,(char *)key_state->public_key_oct,key_state->public_key_oct_len);
      key_state->request_len = key_state->public_key_oct_len + 5;
      key_state->state = libssh2_NB_state_sent;
      goto LAB_00110089;
    }
    errmsg = "Unable to create private key";
  }
  else {
LAB_00110089:
    if (key_state->state == libssh2_NB_state_sent) {
      iVar1 = _libssh2_transport_send
                        (session,key_state->request,key_state->request_len,(uchar *)0x0,0);
      if (iVar1 == -0x25) {
        return -0x25;
      }
      if (iVar1 != 0) {
        errmsg = "Unable to send ECDH_INIT";
        goto LAB_00110141;
      }
      key_state->state = libssh2_NB_state_sent1;
    }
    if (key_state->state == libssh2_NB_state_sent1) {
      iVar1 = _libssh2_packet_require
                        (session,'\x1f',&key_state->data,&key_state->data_len,0,(uchar *)0x0,0,
                         &key_state->req_state);
      if (iVar1 == -0x25) {
        return -0x25;
      }
      if (iVar1 != 0) {
        errmsg = "Timeout waiting for ECDH_REPLY reply";
        goto LAB_00110141;
      }
      key_state->state = libssh2_NB_state_sent2;
    }
    iVar1 = 0;
    if (key_state->state != libssh2_NB_state_sent2) goto LAB_00110148;
    iVar1 = kex_session_ecdh_curve_type(session->kex->name,&type);
    if (iVar1 == 0) {
      iVar1 = ecdh_sha2_nistp(session,type,key_state->data,key_state->data_len,
                              key_state->public_key_oct,key_state->public_key_oct_len,
                              key_state->private_key,&key_state->exchange_state);
      if (iVar1 == -0x25) {
        return -0x25;
      }
      goto LAB_00110148;
    }
LAB_0011011b:
    errmsg = "Unknown KEX nistp curve type";
    iVar1 = -1;
  }
LAB_00110141:
  iVar1 = _libssh2_error(session,iVar1,errmsg);
LAB_00110148:
  kex_method_ecdh_cleanup(session,key_state);
  return iVar1;
}

Assistant:

static int
kex_method_ecdh_key_exchange
(LIBSSH2_SESSION * session, key_exchange_state_low_t * key_state)
{
    int ret = 0;
    int rc = 0;
    unsigned char *s;
    libssh2_curve_type type;

    if(key_state->state == libssh2_NB_state_idle) {

        key_state->public_key_oct = NULL;
        key_state->state = libssh2_NB_state_created;
    }

    if(key_state->state == libssh2_NB_state_created) {
        rc = kex_session_ecdh_curve_type(session->kex->name, &type);

        if(rc) {
            ret = _libssh2_error(session, -1,
                                 "Unknown KEX nistp curve type");
            goto ecdh_clean_exit;
        }

        rc = _libssh2_ecdsa_create_key(session, &key_state->private_key,
                                       &key_state->public_key_oct,
                                       &key_state->public_key_oct_len, type);

        if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to create private key");
            goto ecdh_clean_exit;
        }

        key_state->request[0] = SSH2_MSG_KEX_ECDH_INIT;
        s = key_state->request + 1;
        _libssh2_store_str(&s, (const char *)key_state->public_key_oct,
                           key_state->public_key_oct_len);
        key_state->request_len = key_state->public_key_oct_len + 5;

        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Initiating ECDH SHA2 NISTP256"));

        key_state->state = libssh2_NB_state_sent;
    }

    if(key_state->state == libssh2_NB_state_sent) {
        rc = _libssh2_transport_send(session, key_state->request,
                                     key_state->request_len, NULL, 0);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to send ECDH_INIT");
            goto ecdh_clean_exit;
        }

        key_state->state = libssh2_NB_state_sent1;
    }

    if(key_state->state == libssh2_NB_state_sent1) {
        rc = _libssh2_packet_require(session, SSH2_MSG_KEX_ECDH_REPLY,
                                     &key_state->data, &key_state->data_len,
                                     0, NULL, 0, &key_state->req_state);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Timeout waiting for ECDH_REPLY reply");
            goto ecdh_clean_exit;
        }

        key_state->state = libssh2_NB_state_sent2;
    }

    if(key_state->state == libssh2_NB_state_sent2) {

        rc = kex_session_ecdh_curve_type(session->kex->name, &type);

        if(rc) {
            ret = _libssh2_error(session, -1,
                                 "Unknown KEX nistp curve type");
            goto ecdh_clean_exit;
        }

        ret = ecdh_sha2_nistp(session, type, key_state->data,
                              key_state->data_len,
                              (unsigned char *)key_state->public_key_oct,
                              key_state->public_key_oct_len,
                              key_state->private_key,
                              &key_state->exchange_state);

        if(ret == LIBSSH2_ERROR_EAGAIN) {
            return ret;
        }
    }

ecdh_clean_exit:

    kex_method_ecdh_cleanup(session, key_state);

    return ret;
}